

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

char * rapidjson::internal::WriteExponent(int K,char *buffer)

{
  byte *pbVar1;
  
  if (K < 0) {
    *buffer = '-';
    buffer = buffer + 1;
    K = -K;
  }
  if ((uint)K < 100) {
    if ((uint)K < 10) {
      *buffer = (byte)K | 0x30;
      pbVar1 = (byte *)buffer + 1;
    }
    else {
      *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uint)K * 2);
      pbVar1 = (byte *)buffer + 2;
    }
  }
  else {
    *buffer = (char)((ulong)(uint)K / 100) + 0x30;
    *(undefined2 *)((byte *)buffer + 1) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + ((ulong)(uint)K % 100) * 2);
    pbVar1 = (byte *)buffer + 3;
  }
  return (char *)pbVar1;
}

Assistant:

inline char* WriteExponent(int K, char* buffer) {
    if (K < 0) {
        *buffer++ = '-';
        K = -K;
    }

    if (K >= 100) {
        *buffer++ = static_cast<char>('0' + static_cast<char>(K / 100));
        K %= 100;
        const char* d = GetDigitsLut() + K * 2;
        *buffer++ = d[0];
        *buffer++ = d[1];
    }
    else if (K >= 10) {
        const char* d = GetDigitsLut() + K * 2;
        *buffer++ = d[0];
        *buffer++ = d[1];
    }
    else
        *buffer++ = static_cast<char>('0' + static_cast<char>(K));

    return buffer;
}